

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,DiffuseAreaLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,ShapeHandle *args_4,
          Image *args_5,RGBColorSpace **args_6,bool *args_7,polymorphic_allocator<std::byte> *args_8
          )

{
  uint uVar1;
  undefined1 unaff_retaddr;
  Image *in_stack_00000008;
  ShapeHandle *in_stack_00000010;
  Float in_stack_0000001c;
  SpectrumHandle *in_stack_00000020;
  MediumInterface *in_stack_00000028;
  Transform *in_stack_00000030;
  DiffuseAreaLight *in_stack_00000038;
  Allocator in_stack_00000040;
  RGBColorSpace *in_stack_00000050;
  SpectrumHandle *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  MediumHandle *in_stack_fffffffffffffe28;
  MediumInterface *this_00;
  Image *pIVar2;
  Image *this_01;
  undefined1 local_58 [16];
  
  this_00 = (MediumInterface *)(local_58 + 8);
  pbrt::MediumHandle::MediumHandle
            ((MediumHandle *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (MediumHandle *)in_stack_fffffffffffffe18);
  pIVar2 = (Image *)&stack0xffffffffffffffb8;
  pbrt::MediumInterface::MediumInterface(this_00,in_stack_fffffffffffffe28);
  this_01 = (Image *)local_58;
  pbrt::SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  pbrt::ShapeHandle::ShapeHandle
            ((ShapeHandle *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (ShapeHandle *)in_stack_fffffffffffffe18);
  pbrt::Image::Image(this_01,pIVar2);
  uVar1 = (byte)(in_stack_00000020->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ).bits & 1;
  pbrt::DiffuseAreaLight::DiffuseAreaLight
            (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
             in_stack_0000001c,in_stack_00000010,in_stack_00000008,in_stack_00000050,
             (bool)unaff_retaddr,in_stack_00000040);
  pbrt::Image::~Image((Image *)CONCAT44(in_stack_fffffffffffffe24,uVar1));
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }